

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

char * hts_format_description(htsFormat *format)

{
  htsCompression hVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  char buf [16];
  byte local_48 [16];
  htsFormat *local_38;
  
  switch(format->format) {
  case sam:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 == (char *)0x0) break;
    pcVar5[2] = 'M';
    pcVar5[0] = 'S';
    pcVar5[1] = 'A';
LAB_0010af60:
    pcVar6 = pcVar5 + 3;
    uVar15 = 8;
    uVar11 = 3;
LAB_0010af72:
    *pcVar6 = '\0';
    goto LAB_0010af7c;
  case bam:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'M';
LAB_0010adee:
      pcVar5[0] = 'B';
      pcVar5[1] = 'A';
      goto LAB_0010af60;
    }
    break;
  case bai:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'I';
      goto LAB_0010adee;
    }
    break;
  case cram:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"CRAM",4);
LAB_0010aebb:
      pcVar6 = pcVar5 + 4;
      uVar15 = 8;
      uVar11 = 4;
      goto LAB_0010af72;
    }
    break;
  case crai:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"CRAI",4);
      goto LAB_0010aebb;
    }
    break;
  case vcf:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'F';
      pcVar5[0] = 'V';
      pcVar5[1] = 'C';
      goto LAB_0010af60;
    }
    break;
  case bcf:
    if ((format->version).major == 1) {
      uVar15 = 0x10;
      pcVar5 = (char *)malloc(0x10);
      if (pcVar5 != (char *)0x0) {
        builtin_strncpy(pcVar5,"Legacy BCF",10);
        pcVar6 = pcVar5 + 10;
        uVar15 = 0x10;
        uVar11 = 10;
        goto LAB_0010af72;
      }
    }
    else {
      uVar15 = 8;
      pcVar5 = (char *)malloc(8);
      if (pcVar5 != (char *)0x0) {
        pcVar5[2] = 'F';
        pcVar5[0] = 'B';
        pcVar5[1] = 'C';
        goto LAB_0010af60;
      }
    }
    break;
  case csi:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = 'I';
      pcVar5[0] = 'C';
      pcVar5[1] = 'S';
      goto LAB_0010af60;
    }
    break;
  default:
    uVar15 = 0x10;
    pcVar5 = (char *)malloc(0x10);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"unknown",7);
      pcVar6 = pcVar5 + 7;
      uVar15 = 0x10;
      uVar11 = 7;
      goto LAB_0010af72;
    }
    break;
  case tbi:
    uVar15 = 8;
    pcVar5 = (char *)malloc(8);
    if (pcVar5 != (char *)0x0) {
      builtin_strncpy(pcVar5,"Tabix",5);
      pcVar6 = pcVar5 + 5;
      uVar15 = 8;
      uVar11 = 5;
      goto LAB_0010af72;
    }
  }
  uVar11 = 0;
  pcVar5 = (char *)0x0;
LAB_0010af7c:
  uVar14 = (format->version).major;
  if (-1 < (short)uVar14) {
    uVar13 = uVar11 + 10;
    local_38 = format;
    pcVar6 = pcVar5;
    if (uVar13 < uVar15) {
LAB_0010afca:
      builtin_strncpy(pcVar6 + uVar11," version ",10);
      uVar11 = uVar11 + 9;
      uVar14 = (format->version).major;
      pcVar5 = pcVar6;
    }
    else {
      uVar15 = (uVar13 >> 4 | (uVar13 >> 1 | uVar13) >> 2 | uVar13 >> 1 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 != (char *)0x0) goto LAB_0010afca;
    }
    uVar3 = -uVar14;
    if (0 < (short)uVar14) {
      uVar3 = uVar14;
    }
    uVar13 = 0;
    uVar4 = (uint)uVar3;
    do {
      local_48[uVar13] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
      uVar13 = uVar13 + 1;
      bVar2 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar2);
    if ((short)uVar14 < 0) {
      uVar7 = uVar13 & 0xffffffff;
      uVar13 = (ulong)((int)uVar13 + 1);
      local_48[uVar7] = 0x2d;
    }
    iVar12 = (int)uVar13;
    uVar7 = (long)iVar12 + uVar11 + 1;
    pcVar6 = pcVar5;
    if (uVar7 < uVar15) {
LAB_0010b092:
      pcVar5 = pcVar6;
      iVar9 = 1;
      if (iVar12 < 1) {
        iVar9 = iVar12;
      }
      uVar7 = (ulong)((((int)uVar11 + iVar12) - iVar9) + 1);
      pbVar8 = local_48 + (uVar13 & 0xffffffff);
      do {
        pbVar8 = pbVar8 + -1;
        pcVar5[uVar11] = *pbVar8;
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      pcVar5[uVar7] = '\0';
      uVar11 = uVar7;
    }
    else {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      uVar15 = (uVar7 >> 0x10 | uVar7) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 != (char *)0x0) goto LAB_0010b092;
    }
    format = local_38;
    if (-1 < (local_38->version).minor) {
      uVar13 = uVar11 + 1;
      pcVar6 = pcVar5;
      if (uVar13 < uVar15) {
LAB_0010b134:
        (pcVar6 + uVar11)[0] = '.';
        (pcVar6 + uVar11)[1] = '\0';
        uVar11 = uVar13;
        pcVar5 = pcVar6;
      }
      else {
        uVar15 = uVar13 >> 1 | uVar13;
        uVar15 = uVar15 >> 2 | uVar15;
        uVar15 = uVar15 >> 4 | uVar15;
        uVar15 = uVar15 >> 8 | uVar15;
        uVar15 = (uVar15 >> 0x10 | uVar15) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar15);
        if (pcVar6 != (char *)0x0) goto LAB_0010b134;
      }
      uVar14 = (format->version).minor;
      uVar3 = -uVar14;
      if (0 < (short)uVar14) {
        uVar3 = uVar14;
      }
      uVar13 = 0;
      uVar4 = (uint)uVar3;
      do {
        local_48[uVar13] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
        uVar13 = uVar13 + 1;
        bVar2 = 9 < uVar4;
        uVar4 = uVar4 / 10;
      } while (bVar2);
      if ((short)uVar14 < 0) {
        uVar7 = uVar13 & 0xffffffff;
        uVar13 = (ulong)((int)uVar13 + 1);
        local_48[uVar7] = 0x2d;
      }
      uVar7 = (long)(int)uVar13 + uVar11 + 1;
      pcVar6 = pcVar5;
      if (uVar15 <= uVar7) {
        uVar7 = uVar7 >> 1 | uVar7;
        uVar7 = uVar7 >> 2 | uVar7;
        uVar7 = uVar7 >> 4 | uVar7;
        uVar7 = uVar7 >> 8 | uVar7;
        uVar15 = (uVar7 >> 0x10 | uVar7) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar15);
        if (pcVar6 == (char *)0x0) goto LAB_0010b213;
      }
      pcVar5 = pcVar6;
      iVar12 = (int)uVar13 + 1;
      pbVar8 = local_48 + (uVar13 & 0xffffffff);
      do {
        pbVar8 = pbVar8 + -1;
        pcVar5[uVar11] = *pbVar8;
        uVar11 = uVar11 + 1;
        iVar12 = iVar12 + -1;
      } while (1 < iVar12);
      pcVar5[uVar11] = '\0';
    }
  }
LAB_0010b213:
  hVar1 = format->compression;
  pcVar6 = pcVar5;
  if (hVar1 == gzip) {
    uVar13 = uVar11 + 0x11;
    if (uVar15 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 == (char *)0x0) goto LAB_0010b322;
    }
    uVar16._0_1_ = ' ';
    uVar16._1_1_ = 'g';
    uVar16._2_1_ = 'z';
    uVar16._3_1_ = 'i';
    uVar17._0_1_ = 'p';
    uVar17._1_1_ = '-';
    uVar17._2_1_ = 'c';
    uVar17._3_1_ = 'o';
LAB_0010b30f:
    pcVar5 = pcVar6 + uVar11;
    *(undefined4 *)pcVar5 = uVar16;
    *(undefined4 *)(pcVar5 + 4) = uVar17;
    pcVar5[8] = 'm';
    pcVar5[9] = 'p';
    pcVar5[10] = 'r';
    pcVar5[0xb] = 'e';
    pcVar5[0xc] = 's';
    pcVar5[0xd] = 's';
    pcVar5[0xe] = 'e';
    pcVar5[0xf] = 'd';
    lVar10 = 0x10;
LAB_0010b318:
    uVar11 = uVar11 + lVar10;
    pcVar6[uVar11] = '\0';
    pcVar5 = pcVar6;
  }
  else {
    if (hVar1 == bgzf) {
      if ((tbi < format->format) || ((0x1610U >> (format->format & 0x1f) & 1) == 0)) {
        uVar13 = uVar11 + 0x11;
        if (uVar15 <= uVar13) {
          uVar13 = uVar13 >> 1 | uVar13;
          uVar13 = uVar13 >> 2 | uVar13;
          uVar13 = uVar13 >> 4 | uVar13;
          uVar13 = uVar13 >> 8 | uVar13;
          uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
          pcVar6 = (char *)realloc(pcVar5,uVar15);
          if (pcVar6 == (char *)0x0) goto LAB_0010b322;
        }
        uVar16._0_1_ = ' ';
        uVar16._1_1_ = 'B';
        uVar16._2_1_ = 'G';
        uVar16._3_1_ = 'Z';
        uVar17._0_1_ = 'F';
        uVar17._1_1_ = '-';
        uVar17._2_1_ = 'c';
        uVar17._3_1_ = 'o';
        goto LAB_0010b30f;
      }
LAB_0010b244:
      uVar13 = uVar11 + 0xc;
      if (uVar15 <= uVar13) {
        uVar13 = uVar13 >> 1 | uVar13;
        uVar13 = uVar13 >> 2 | uVar13;
        uVar13 = uVar13 >> 4 | uVar13;
        uVar13 = uVar13 >> 8 | uVar13;
        uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
        pcVar6 = (char *)realloc(pcVar5,uVar15);
        if (pcVar6 == (char *)0x0) goto LAB_0010b322;
      }
      builtin_strncpy(pcVar6 + uVar11," compressed",0xb);
      lVar10 = 0xb;
      goto LAB_0010b318;
    }
    if (hVar1 == custom) goto LAB_0010b244;
  }
LAB_0010b322:
  pcVar6 = pcVar5;
  switch(format->category) {
  case sequence_data:
    uVar13 = uVar11 + 10;
    if (uVar15 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 == (char *)0x0) goto switchD_0010b33e_default;
    }
    builtin_strncpy(pcVar6 + uVar11," sequence",9);
    lVar10 = 9;
    break;
  case variant_data:
    uVar13 = uVar11 + 0x11;
    if (uVar15 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 == (char *)0x0) goto switchD_0010b33e_default;
    }
    builtin_strncpy(pcVar6 + uVar11," variant calling",0x10);
    lVar10 = 0x10;
    break;
  case index_file:
    uVar13 = uVar11 + 7;
    if (uVar15 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 == (char *)0x0) goto switchD_0010b33e_default;
    }
    builtin_strncpy(pcVar6 + uVar11," index",6);
    lVar10 = 6;
    break;
  case region_list:
    uVar13 = uVar11 + 0x10;
    if (uVar15 <= uVar13) {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      uVar15 = (uVar13 >> 0x10 | uVar13) + 1;
      pcVar6 = (char *)realloc(pcVar5,uVar15);
      if (pcVar6 == (char *)0x0) goto switchD_0010b33e_default;
    }
    builtin_strncpy(pcVar6 + uVar11," genomic region",0xf);
    lVar10 = 0xf;
    break;
  default:
    goto switchD_0010b33e_default;
  }
  uVar11 = uVar11 + lVar10;
  pcVar6[uVar11] = '\0';
  pcVar5 = pcVar6;
switchD_0010b33e_default:
  pcVar6 = pcVar5;
  if (((format->compression == no_compression) && (format->format < (tbi|text_format))) &&
     ((0x2188U >> (format->format & 0x1f) & 1) != 0)) {
    uVar13 = uVar11 + 6;
    if ((uVar15 <= uVar13) &&
       (uVar13 = uVar13 >> 1 | uVar13, uVar13 = uVar13 >> 2 | uVar13, uVar13 = uVar13 >> 4 | uVar13,
       uVar13 = uVar13 >> 8 | uVar13, pcVar6 = (char *)realloc(pcVar5,(uVar13 >> 0x10 | uVar13) + 1)
       , pcVar6 == (char *)0x0)) {
      return pcVar5;
    }
    builtin_strncpy(pcVar6 + uVar11," text",5);
  }
  else {
    uVar13 = uVar11 + 6;
    if ((uVar15 <= uVar13) &&
       (uVar13 = uVar13 >> 1 | uVar13, uVar13 = uVar13 >> 2 | uVar13, uVar13 = uVar13 >> 4 | uVar13,
       uVar13 = uVar13 >> 8 | uVar13, pcVar6 = (char *)realloc(pcVar5,(uVar13 >> 0x10 | uVar13) + 1)
       , pcVar6 == (char *)0x0)) {
      return pcVar5;
    }
    builtin_strncpy(pcVar6 + uVar11," data",5);
  }
  pcVar6[uVar11 + 5] = '\0';
  return pcVar6;
}

Assistant:

char *hts_format_description(const htsFormat *format)
{
    kstring_t str = { 0, 0, NULL };

    switch (format->format) {
    case sam:   kputs("SAM", &str); break;
    case bam:   kputs("BAM", &str); break;
    case cram:  kputs("CRAM", &str); break;
    case vcf:   kputs("VCF", &str); break;
    case bcf:
        if (format->version.major == 1) kputs("Legacy BCF", &str);
        else kputs("BCF", &str);
        break;
    case bai:   kputs("BAI", &str); break;
    case crai:  kputs("CRAI", &str); break;
    case csi:   kputs("CSI", &str); break;
    case tbi:   kputs("Tabix", &str); break;
    default:    kputs("unknown", &str); break;
    }

    if (format->version.major >= 0) {
        kputs(" version ", &str);
        kputw(format->version.major, &str);
        if (format->version.minor >= 0) {
            kputc('.', &str);
            kputw(format->version.minor, &str);
        }
    }

    switch (format->compression) {
    case custom: kputs(" compressed", &str); break;
    case gzip:   kputs(" gzip-compressed", &str); break;
    case bgzf:
        switch (format->format) {
        case bam:
        case bcf:
        case csi:
        case tbi:
            // These are by definition BGZF, so just use the generic term
            kputs(" compressed", &str);
            break;
        default:
            kputs(" BGZF-compressed", &str);
            break;
        }
        break;
    default: break;
    }

    switch (format->category) {
    case sequence_data: kputs(" sequence", &str); break;
    case variant_data:  kputs(" variant calling", &str); break;
    case index_file:    kputs(" index", &str); break;
    case region_list:   kputs(" genomic region", &str); break;
    default: break;
    }

    if (format->compression == no_compression)
        switch (format->format) {
        case sam:
        case crai:
        case vcf:
        case bed:
            kputs(" text", &str);
            break;

        default:
            kputs(" data", &str);
            break;
        }
    else
        kputs(" data", &str);

    return ks_release(&str);
}